

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int i2c_write_i2c_block_data(uint handle,uint reg,char *buf,uint count)

{
  int iVar1;
  gpioExtent_t ext [1];
  
  ext[0].size = (size_t)count;
  ext[0].ptr = buf;
  iVar1 = pigpio_command_ext(gPigCommand,0x44,handle,reg,count,1,ext,1);
  return iVar1;
}

Assistant:

int i2c_write_i2c_block_data(
   unsigned handle, unsigned reg, char *buf, unsigned count)
{
   gpioExtent_t ext[1];

   /*
   p1=handle
   p2=reg
   p3=count
   ## extension ##
   char buf[count]
   */

   ext[0].size = count;
   ext[0].ptr = buf;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_I2CWI, handle, reg, count, 1, ext, 1);
}